

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_sub_ps_mips64(CPUMIPSState_conflict5 *env,uint64_t fdt0,uint64_t fdt1)

{
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  uint32_t wth2;
  uint32_t wt2;
  uint32_t fsth1;
  uint32_t fst1;
  uint32_t fsth0;
  uint32_t fst0;
  uint64_t fdt1_local;
  uint64_t fdt0_local;
  CPUMIPSState_conflict5 *env_local;
  
  fVar1 = float32_sub_mips64((float32)fdt0,(float32)fdt1,&(env->active_fpu).fp_status);
  fVar2 = float32_sub_mips64((float32)(fdt0 >> 0x20),(float32)(fdt1 >> 0x20),
                             &(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1);
}

Assistant:

FLOAT_BINOP(add)
FLOAT_BINOP(sub)
FLOAT_BINOP(mul)
FLOAT_BINOP(div)
#undef FLOAT_BINOP

/* MIPS specific binary operations */
uint64_t helper_float_recip2_d(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt2)
{
    fdt2 = float64_mul(fdt0, fdt2, &env->active_fpu.fp_status);
    fdt2 = float64_chs(float64_sub(fdt2, float64_one,
                                   &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return fdt2;
}